

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

CURLcode file_do(connectdata *conn,_Bool *done)

{
  bool bVar1;
  Curl_easy *data;
  Curl_easy *data_00;
  undefined8 *puVar2;
  char *pcVar3;
  _Bool _Var4;
  int iVar5;
  CURLcode CVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  curl_off_t cVar10;
  __off64_t _Var11;
  size_t len;
  size_t sVar12;
  undefined8 uVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  size_t sVar17;
  long lVar18;
  size_t sVar19;
  bool bVar20;
  curltime cVar21;
  curl_off_t local_170;
  tm buffer;
  char header [80];
  stat statbuf;
  
  data = conn->data;
  pcVar15 = (data->state).buffer;
  *done = true;
  Curl_initinfo(data);
  Curl_pgrsStartNow(data);
  data_00 = conn->data;
  puVar2 = (undefined8 *)(data_00->req).protop;
  if ((data->set).upload != true) {
    iVar5 = *(int *)(puVar2 + 2);
    iVar7 = fstat64(iVar5,(stat64 *)&statbuf);
    if (iVar7 == -1) {
      local_170 = 0;
    }
    else {
      local_170 = statbuf.st_size;
      (data->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((data->state).range == (char *)0x0) && ((data->set).timecondition != CURL_TIMECOND_NONE)
          ) && (_Var4 = Curl_meets_timecondition(data,statbuf.st_mtim.tv_sec), !_Var4)) {
        *done = true;
        return CURLE_OK;
      }
    }
    if ((((data->set).opt_no_body == true) && (iVar7 != -1)) &&
       ((data->set).include_header != false)) {
      curl_msnprintf(header,0x50,"Content-Length: %ld\r\n");
      CVar6 = Curl_client_write(conn,3,header,0);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      CVar6 = Curl_client_write(conn,3,"Accept-ranges: bytes\r\n",0);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      CVar6 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      iVar5 = 6;
      if (buffer.tm_wday != 0) {
        iVar5 = buffer.tm_wday + -1;
      }
      curl_msnprintf(header,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                     Curl_wkday[iVar5],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon],
                     (ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                     (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec);
      CVar6 = Curl_client_write(conn,3,header,0);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      Curl_pgrsSetDownloadSize(data,local_170);
      return CURLE_OK;
    }
    CVar6 = Curl_range(conn);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    cVar10 = (data->state).resume_from;
    if (cVar10 < 0) {
      if (iVar7 == -1) {
        Curl_failf(data,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      cVar10 = cVar10 + statbuf.st_size;
      (data->state).resume_from = cVar10;
    }
    if (local_170 < cVar10) {
      Curl_failf(data,"failed to resume file:// transfer");
    }
    else {
      lVar16 = (data->req).maxdownload;
      lVar18 = local_170 - cVar10;
      if (0 < lVar16) {
        lVar18 = lVar16;
      }
      bVar20 = lVar18 != 0;
      if (iVar7 != -1) {
        Curl_pgrsSetDownloadSize(data,lVar18);
        cVar10 = (data->state).resume_from;
      }
      if ((cVar10 == 0) || (_Var11 = lseek64(iVar5,cVar10,0), cVar10 == _Var11)) {
        bVar1 = iVar7 != -1 && bVar20;
        Curl_pgrsTime(data,TIMER_STARTTRANSFER);
        lVar16 = 0;
        CVar6 = CURLE_OK;
        while (CVar6 == CURLE_OK) {
          sVar17 = (data->set).buffer_size;
          if (iVar7 != -1 && bVar20) {
            if (lVar18 < (long)sVar17) {
              sVar17 = curlx_sotouz(lVar18);
            }
          }
          else {
            sVar17 = sVar17 - 1;
          }
          len = read(iVar5,pcVar15,sVar17);
          if (0 < (long)len) {
            pcVar15[len] = '\0';
          }
          if (((long)len < 1) || (lVar18 == 0 && bVar1)) break;
          sVar19 = 0;
          if (bVar1) {
            sVar19 = len;
          }
          CVar6 = Curl_client_write(conn,1,pcVar15,len);
          if (CVar6 != CURLE_OK) {
            return CVar6;
          }
          lVar16 = lVar16 + len;
          lVar18 = lVar18 - sVar19;
          Curl_pgrsSetDownloadCounter(data,lVar16);
          iVar8 = Curl_pgrsUpdate(conn);
          CVar6 = CURLE_ABORTED_BY_CALLBACK;
          if (iVar8 == 0) {
            cVar21 = Curl_now();
            CVar6 = Curl_speedcheck(data,cVar21);
          }
        }
        iVar5 = Curl_pgrsUpdate(conn);
        if (iVar5 != 0) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
        return CVar6;
      }
    }
    return CURLE_BAD_DOWNLOAD_RESUME;
  }
  pcVar15 = (char *)*puVar2;
  pcVar9 = strchr(pcVar15,0x2f);
  pcVar3 = (data_00->state).buffer;
  (data_00->req).upload_fromhere = pcVar3;
  if (pcVar9 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar9[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar5 = open64(pcVar15,(uint)((data_00->state).resume_from != 0) * 0x200 + 0x241,
                 (data_00->set).new_file_perms);
  if (iVar5 < 0) {
    uVar13 = *puVar2;
    pcVar15 = "Can\'t open %s for writing";
LAB_0010a99c:
    Curl_failf(data_00,pcVar15,uVar13);
    CVar6 = CURLE_WRITE_ERROR;
  }
  else {
    lVar16 = (data_00->state).infilesize;
    if (lVar16 != -1) {
      Curl_pgrsSetUploadSize(data_00,lVar16);
    }
    if ((data_00->state).resume_from < 0) {
      iVar7 = fstat64(iVar5,(stat64 *)&statbuf);
      if (iVar7 != 0) {
        close(iVar5);
        uVar13 = *puVar2;
        pcVar15 = "Can\'t get the size of %s";
        goto LAB_0010a99c;
      }
      (data_00->state).resume_from = statbuf.st_size;
    }
    CVar6 = CURLE_OK;
    lVar16 = 0;
    while( true ) {
      if ((CVar6 != CURLE_OK) ||
         (CVar6 = Curl_fillreadbuffer(conn,(int)(data_00->set).buffer_size,(int *)header),
         CVar6 != CURLE_OK)) goto LAB_0010a9d5;
      sVar17 = (size_t)(int)header._0_4_;
      if ((long)sVar17 < 1) break;
      lVar18 = (data_00->state).resume_from;
      pcVar15 = pcVar3;
      if (lVar18 != 0) {
        lVar14 = 0;
        if (lVar18 < (long)sVar17) {
          lVar14 = lVar18;
        }
        sVar12 = -(lVar18 - sVar17);
        cVar10 = lVar18 - sVar17;
        if (lVar18 < (long)sVar17) {
          cVar10 = 0;
        }
        else {
          sVar12 = 0;
        }
        (data_00->state).resume_from = cVar10;
        pcVar15 = pcVar3 + lVar14;
        sVar17 = sVar12;
      }
      sVar12 = write(iVar5,pcVar15,sVar17);
      if (sVar12 != sVar17) {
        CVar6 = CURLE_SEND_ERROR;
        goto LAB_0010a9d5;
      }
      lVar16 = lVar16 + sVar17;
      Curl_pgrsSetUploadCounter(data_00,lVar16);
      iVar7 = Curl_pgrsUpdate(conn);
      CVar6 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar7 == 0) {
        cVar21 = Curl_now();
        CVar6 = Curl_speedcheck(data_00,cVar21);
      }
    }
    iVar7 = Curl_pgrsUpdate(conn);
    CVar6 = CURLE_ABORTED_BY_CALLBACK;
    if (iVar7 == 0) {
      CVar6 = CURLE_OK;
    }
LAB_0010a9d5:
    close(iVar5);
  }
  return CVar6;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = 0;
  bool size_known;
  bool fstated = FALSE;
  ssize_t nread;
  struct Curl_easy *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_initinfo(data);
  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which for FILE can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && data->set.include_header && fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    snprintf(header, sizeof(header),
             "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, header, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_BOTH,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    snprintf(header, sizeof(header),
             "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
             Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
             tm->tm_mday,
             Curl_month[tm->tm_mon],
             tm->tm_year + 1900,
             tm->tm_hour,
             tm->tm_min,
             tm->tm_sec);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, header, 0);
    if(!result)
      /* set the file size to make it available post transfer */
      Curl_pgrsSetDownloadSize(data, expected_size);
    return result;
  }

  /* Check whether file range has been specified */
  result = Curl_range(conn);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream iff the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size == 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}